

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O3

void ContextBlockSplitterFinishBlock(ContextBlockSplitter *self,MemoryManager *m,int is_final)

{
  int *piVar1;
  long *plVar2;
  uint32_t uVar3;
  ulong uVar4;
  BlockSplit *pBVar5;
  double dVar6;
  uint32_t *puVar7;
  bool bVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  double *pdVar16;
  HistogramLiteral *pHVar17;
  HistogramLiteral *pHVar18;
  long lVar19;
  ulong uVar20;
  uint *__dest;
  uint *puVar21;
  long lVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double entropy [13];
  double combined_entropy [26];
  void *local_210;
  double local_208;
  HistogramLiteral *local_200;
  double *local_1f8;
  ulong local_1f0;
  double local_1e8;
  int local_1dc;
  double local_1d8;
  double dStack_1d0;
  HistogramLiteral *local_1c8;
  void *local_1c0;
  undefined1 local_1b8 [24];
  MemoryManager *local_1a0;
  long local_198;
  HistogramLiteral *local_190;
  HistogramLiteral *local_188;
  double *local_180;
  double adStack_178 [14];
  double local_108 [27];
  
  local_1dc = is_final;
  uVar4 = self->min_block_size_;
  uVar14 = self->block_size_;
  if (self->block_size_ < uVar4) {
    self->block_size_ = uVar4;
    uVar14 = uVar4;
  }
  pBVar5 = self->split_;
  uVar4 = self->num_contexts_;
  pHVar18 = self->histograms_;
  if (self->num_blocks_ == 0) {
    *pBVar5->lengths = (uint32_t)uVar14;
    *pBVar5->types = '\0';
    if (uVar4 != 0) {
      uVar14 = 0;
      do {
        uVar20 = self->alphabet_size_;
        dVar6 = 0.0;
        uVar13 = 0;
        pHVar17 = pHVar18;
        if ((uVar20 & 1) != 0) goto LAB_01125caf;
        while (pHVar17 < (HistogramLiteral *)(pHVar18->data_ + uVar20)) {
          uVar9 = (ulong)pHVar17->data_[0];
          pHVar17 = (HistogramLiteral *)(pHVar17->data_ + 1);
          uVar13 = uVar13 + uVar9;
          if (uVar9 < 0x100) {
            dVar23 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar9];
          }
          else {
            dVar23 = log2((double)uVar9);
          }
          dVar6 = dVar6 - (double)uVar9 * dVar23;
LAB_01125caf:
          uVar9 = (ulong)pHVar17->data_[0];
          pHVar17 = (HistogramLiteral *)(pHVar17->data_ + 1);
          uVar13 = uVar13 + uVar9;
          if (uVar9 < 0x100) {
            dVar23 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar9];
          }
          else {
            dVar23 = log2((double)uVar9);
          }
          dVar6 = dVar6 - (double)uVar9 * dVar23;
        }
        auVar25._8_4_ = (int)(uVar13 >> 0x20);
        auVar25._0_8_ = uVar13;
        auVar25._12_4_ = 0x45300000;
        dVar23 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
        if (uVar13 != 0) {
          if (uVar13 < 0x100) {
            dVar24 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar13];
          }
          else {
            dVar24 = log2(dVar23);
          }
          dVar6 = dVar6 + dVar24 * dVar23;
        }
        if (dVar23 <= dVar6) {
          dVar23 = dVar6;
        }
        self->last_entropy_[uVar14] = dVar23;
        self->last_entropy_[uVar4 + uVar14] = dVar23;
        uVar14 = uVar14 + 1;
        pHVar18 = pHVar18 + 1;
      } while (uVar4 != uVar14);
    }
    self->num_blocks_ = self->num_blocks_ + 1;
    pBVar5->num_types = pBVar5->num_types + 1;
    uVar14 = self->curr_histogram_ix_ + uVar4;
    self->curr_histogram_ix_ = uVar14;
    if ((uVar14 < *self->histograms_size_) && (sVar15 = self->num_contexts_, sVar15 != 0)) {
      pHVar18 = self->histograms_ + uVar14;
      do {
        switchD_00569a20::default(pHVar18,0,0x408);
        pHVar18->bit_cost_ = INFINITY;
        pHVar18 = pHVar18 + 1;
        sVar15 = sVar15 - 1;
      } while (sVar15 != 0);
    }
    self->block_size_ = 0;
    goto LAB_01126550;
  }
  if (uVar14 == 0) goto LAB_01126550;
  local_1f8 = self->last_entropy_;
  local_200 = pHVar18;
  local_1a0 = m;
  if ((uVar4 & 0x7fffffffffffffff) == 0) {
    local_210 = (void *)0x0;
    local_208 = 0.0;
    local_1e8 = 0.0;
    if (uVar4 != 0) goto LAB_01125df0;
    local_210 = (void *)0x0;
    bVar8 = true;
  }
  else {
    local_210 = duckdb_brotli::BrotliAllocate(m,uVar4 * 0x820);
LAB_01125df0:
    local_1e8 = 0.0;
    local_208 = 0.0;
    local_198 = uVar4 * 0x410;
    uVar14 = 0;
    local_1c8 = pHVar18;
    local_1c0 = local_210;
    do {
      local_190 = pHVar18 + uVar14;
      pHVar18 = local_190 + self->curr_histogram_ix_;
      uVar20 = self->alphabet_size_;
      puVar7 = pHVar18->data_;
      dVar6 = 0.0;
      uVar13 = 0;
      local_1f0 = uVar14;
      local_188 = pHVar18;
      if ((uVar20 & 1) != 0) goto LAB_01125ef6;
      while (pHVar18 < (HistogramLiteral *)(puVar7 + uVar20)) {
        uVar14 = (ulong)pHVar18->data_[0];
        pHVar18 = (HistogramLiteral *)(pHVar18->data_ + 1);
        uVar13 = uVar13 + uVar14;
        if (uVar14 < 0x100) {
          dVar23 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar14];
        }
        else {
          dVar23 = log2((double)uVar14);
        }
        dVar6 = dVar6 - (double)uVar14 * dVar23;
LAB_01125ef6:
        uVar14 = (ulong)pHVar18->data_[0];
        pHVar18 = (HistogramLiteral *)(pHVar18->data_ + 1);
        uVar13 = uVar13 + uVar14;
        if (uVar14 < 0x100) {
          dVar23 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar14];
        }
        else {
          dVar23 = log2((double)uVar14);
        }
        dVar6 = dVar6 - (double)uVar14 * dVar23;
      }
      auVar26._8_4_ = (int)(uVar13 >> 0x20);
      auVar26._0_8_ = uVar13;
      auVar26._12_4_ = 0x45300000;
      local_1b8._8_8_ = auVar26._8_8_ - 1.9342813113834067e+25;
      uVar14 = (ulong)local_1b8._8_8_ >> 0x20;
      local_1b8._0_8_ =
           (double)local_1b8._8_8_ + ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0)
      ;
      if (uVar13 != 0) {
        if (uVar13 < 0x100) {
          dVar23 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar13];
        }
        else {
          local_1b8._8_4_ = (int)local_1b8._8_8_;
          local_1b8._12_4_ = (int)uVar14;
          dVar23 = log2((double)local_1b8._0_8_);
        }
        dVar6 = dVar6 + dVar23 * (double)local_1b8._0_8_;
      }
      uVar14 = (ulong)local_1b8._8_8_ >> 0x20;
      if ((double)local_1b8._0_8_ <= dVar6) {
        local_1b8._0_8_ = dVar6;
      }
      adStack_178[local_1f0] = (double)local_1b8._0_8_;
      pdVar10 = &local_208;
      lVar22 = 0;
      local_1b8._8_4_ = (int)local_1b8._8_8_;
      local_1b8._12_4_ = (int)uVar14;
      uVar14 = local_1f0;
      bVar8 = true;
      do {
        bVar12 = bVar8;
        lVar19 = lVar22 * uVar4 + uVar14;
        __dest = (uint *)((long)local_210 + lVar19 * 0x410);
        sVar15 = self->last_histogram_ix_[lVar22];
        local_180 = pdVar10;
        switchD_00b041bd::default(__dest,local_188,0x410);
        uVar14 = local_1f0;
        plVar2 = (long *)((long)local_210 + lVar19 * 0x410 + 0x400);
        *plVar2 = *plVar2 + local_190[sVar15].total_count_;
        lVar11 = 0;
        do {
          piVar1 = (int *)((long)local_1c0 + lVar11 * 4 + lVar22 * local_198);
          *piVar1 = *piVar1 + local_1c8[sVar15].data_[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x100);
        puVar21 = __dest + self->alphabet_size_;
        dVar6 = 0.0;
        uVar20 = 0;
        if ((self->alphabet_size_ & 1) != 0) goto LAB_011260fa;
        while (__dest < puVar21) {
          uVar13 = (ulong)*__dest;
          __dest = __dest + 1;
          uVar20 = uVar20 + uVar13;
          dVar23 = (double)uVar13;
          if (uVar13 < 0x100) {
            dVar24 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar13];
          }
          else {
            local_1d8 = dVar23;
            dVar24 = log2(dVar23);
            dVar23 = local_1d8;
          }
          dVar6 = dVar6 - dVar23 * dVar24;
LAB_011260fa:
          uVar13 = (ulong)*__dest;
          __dest = __dest + 1;
          uVar20 = uVar20 + uVar13;
          dVar23 = (double)uVar13;
          if (uVar13 < 0x100) {
            dVar24 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar13];
          }
          else {
            local_1d8 = dVar23;
            dVar24 = log2(dVar23);
            dVar23 = local_1d8;
          }
          dVar6 = dVar6 - dVar23 * dVar24;
        }
        auVar27._8_4_ = (int)(uVar20 >> 0x20);
        auVar27._0_8_ = uVar20;
        auVar27._12_4_ = 0x45300000;
        dVar24 = auVar27._8_8_ - 1.9342813113834067e+25;
        dVar23 = dVar24 + ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0);
        if (uVar20 != 0) {
          if (uVar20 < 0x100) {
            dVar24 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar20];
          }
          else {
            local_1d8 = dVar23;
            dStack_1d0 = dVar24;
            dVar24 = log2(dVar23);
            dVar23 = local_1d8;
          }
          dVar6 = dVar6 + dVar24 * dVar23;
        }
        if (dVar23 <= dVar6) {
          dVar23 = dVar6;
        }
        local_108[lVar19] = dVar23;
        *local_180 = ((dVar23 - (double)local_1b8._0_8_) - local_1f8[lVar19]) + *local_180;
        lVar22 = 1;
        pdVar10 = &local_1e8;
        bVar8 = false;
      } while (bVar12);
      uVar14 = uVar14 + 1;
      local_1c8 = local_1c8 + 1;
      local_1c0 = (void *)((long)local_1c0 + 0x410);
      pHVar18 = local_200;
    } while (uVar14 != uVar4);
    bVar8 = false;
  }
  uVar14 = pBVar5->num_types;
  if (((self->max_block_types_ <= uVar14) || (local_208 <= self->split_threshold_)) ||
     (local_1e8 <= self->split_threshold_)) {
    uVar3 = (uint32_t)self->block_size_;
    sVar15 = self->num_blocks_;
    if (local_208 + -20.0 <= local_1e8) {
      puVar7 = pBVar5->lengths + (sVar15 - 1);
      *puVar7 = *puVar7 + uVar3;
      if (!bVar8) {
        pdVar10 = local_108;
        lVar22 = 0;
        uVar14 = uVar4;
        pHVar18 = local_200;
        pdVar16 = local_1f8;
        do {
          switchD_00b041bd::default
                    ((void *)((long)pHVar18[self->last_histogram_ix_[0]].data_ + lVar22),
                     (void *)((long)local_210 + lVar22),0x410);
          pHVar18 = local_200;
          dVar6 = *pdVar10;
          *pdVar16 = dVar6;
          if (pBVar5->num_types == 1) {
            pdVar16[uVar4] = dVar6;
          }
          sVar15 = self->curr_histogram_ix_;
          switchD_00569a20::default((void *)((long)local_200[sVar15].data_ + lVar22),0,0x408);
          *(undefined8 *)((long)&pHVar18[sVar15].bit_cost_ + lVar22) = 0x7ff0000000000000;
          pdVar16 = pdVar16 + 1;
          pdVar10 = pdVar10 + 1;
          lVar22 = lVar22 + 0x410;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      self->block_size_ = 0;
      uVar14 = self->merge_last_count_ + 1;
      self->merge_last_count_ = uVar14;
      if (1 < uVar14) {
        self->target_block_size_ = self->target_block_size_ + self->min_block_size_;
      }
    }
    else {
      pBVar5->lengths[sVar15] = uVar3;
      pBVar5->types[sVar15] = pBVar5->types[sVar15 - 2];
      auVar25 = *(undefined1 (*) [16])self->last_histogram_ix_;
      auVar28._0_8_ = auVar25._8_8_;
      auVar28._8_4_ = auVar25._0_4_;
      auVar28._12_4_ = auVar25._4_4_;
      *(undefined1 (*) [16])self->last_histogram_ix_ = auVar28;
      if (!bVar8) {
        pdVar16 = local_108 + uVar4;
        lVar22 = 0;
        uVar14 = uVar4;
        pdVar10 = local_1f8;
        do {
          switchD_00b041bd::default
                    ((void *)((long)local_200[self->last_histogram_ix_[0]].data_ + lVar22),
                     (void *)((long)local_210 + lVar22 + uVar4 * 0x410),0x410);
          pHVar18 = local_200;
          pdVar10[uVar4] = *pdVar10;
          *pdVar10 = *pdVar16;
          sVar15 = self->curr_histogram_ix_;
          switchD_00569a20::default((void *)((long)local_200[sVar15].data_ + lVar22),0,0x408);
          *(undefined8 *)((long)&pHVar18[sVar15].bit_cost_ + lVar22) = 0x7ff0000000000000;
          pdVar10 = pdVar10 + 1;
          pdVar16 = pdVar16 + 1;
          lVar22 = lVar22 + 0x410;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      self->num_blocks_ = self->num_blocks_ + 1;
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      self->target_block_size_ = self->min_block_size_;
    }
  }
  else {
    sVar15 = self->num_blocks_;
    pBVar5->lengths[sVar15] = (uint32_t)self->block_size_;
    pBVar5->types[sVar15] = (uint8_t)uVar14;
    self->last_histogram_ix_[1] = self->last_histogram_ix_[0];
    self->last_histogram_ix_[0] = pBVar5->num_types * uVar4;
    if (!bVar8) {
      uVar14 = 0;
      do {
        local_1f8[uVar4 + uVar14] = local_1f8[uVar14];
        local_1f8[uVar14] = adStack_178[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar4 != uVar14);
    }
    self->num_blocks_ = self->num_blocks_ + 1;
    pBVar5->num_types = pBVar5->num_types + 1;
    uVar14 = self->curr_histogram_ix_ + uVar4;
    self->curr_histogram_ix_ = uVar14;
    if ((uVar14 < *self->histograms_size_) && (sVar15 = self->num_contexts_, sVar15 != 0)) {
      pHVar18 = self->histograms_ + uVar14;
      do {
        switchD_00569a20::default(pHVar18,0,0x408);
        pHVar18->bit_cost_ = INFINITY;
        pHVar18 = pHVar18 + 1;
        sVar15 = sVar15 - 1;
      } while (sVar15 != 0);
    }
    self->block_size_ = 0;
    self->merge_last_count_ = 0;
    self->target_block_size_ = self->min_block_size_;
  }
  duckdb_brotli::BrotliFree(local_1a0,local_210);
LAB_01126550:
  if (local_1dc != 0) {
    *self->histograms_size_ = uVar4 * pBVar5->num_types;
    pBVar5->num_blocks = self->num_blocks_;
  }
  return;
}

Assistant:

static void ContextBlockSplitterFinishBlock(
    ContextBlockSplitter* self, MemoryManager* m, BROTLI_BOOL is_final) {
  BlockSplit* split = self->split_;
  const size_t num_contexts = self->num_contexts_;
  double* last_entropy = self->last_entropy_;
  HistogramLiteral* histograms = self->histograms_;

  if (self->block_size_ < self->min_block_size_) {
    self->block_size_ = self->min_block_size_;
  }
  if (self->num_blocks_ == 0) {
    size_t i;
    /* Create first block. */
    split->lengths[0] = (uint32_t)self->block_size_;
    split->types[0] = 0;

    for (i = 0; i < num_contexts; ++i) {
      last_entropy[i] =
          BitsEntropy(histograms[i].data_, self->alphabet_size_);
      last_entropy[num_contexts + i] = last_entropy[i];
    }
    ++self->num_blocks_;
    ++split->num_types;
    self->curr_histogram_ix_ += num_contexts;
    if (self->curr_histogram_ix_ < *self->histograms_size_) {
      ClearHistogramsLiteral(
          &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
    }
    self->block_size_ = 0;
  } else if (self->block_size_ > 0) {
    /* Try merging the set of histograms for the current block type with the
       respective set of histograms for the last and second last block types.
       Decide over the split based on the total reduction of entropy across
       all contexts. */
    double entropy[BROTLI_MAX_STATIC_CONTEXTS];
    HistogramLiteral* combined_histo =
        BROTLI_ALLOC(m, HistogramLiteral, 2 * num_contexts);
    double combined_entropy[2 * BROTLI_MAX_STATIC_CONTEXTS];
    double diff[2] = { 0.0 };
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(combined_histo)) return;
    for (i = 0; i < num_contexts; ++i) {
      size_t curr_histo_ix = self->curr_histogram_ix_ + i;
      size_t j;
      entropy[i] = BitsEntropy(histograms[curr_histo_ix].data_,
                               self->alphabet_size_);
      for (j = 0; j < 2; ++j) {
        size_t jx = j * num_contexts + i;
        size_t last_histogram_ix = self->last_histogram_ix_[j] + i;
        combined_histo[jx] = histograms[curr_histo_ix];
        HistogramAddHistogramLiteral(&combined_histo[jx],
            &histograms[last_histogram_ix]);
        combined_entropy[jx] = BitsEntropy(
            &combined_histo[jx].data_[0], self->alphabet_size_);
        diff[j] += combined_entropy[jx] - entropy[i] - last_entropy[jx];
      }
    }

    if (split->num_types < self->max_block_types_ &&
        diff[0] > self->split_threshold_ &&
        diff[1] > self->split_threshold_) {
      /* Create new block. */
      split->lengths[self->num_blocks_] = (uint32_t)self->block_size_;
      split->types[self->num_blocks_] = (uint8_t)split->num_types;
      self->last_histogram_ix_[1] = self->last_histogram_ix_[0];
      self->last_histogram_ix_[0] = split->num_types * num_contexts;
      for (i = 0; i < num_contexts; ++i) {
        last_entropy[num_contexts + i] = last_entropy[i];
        last_entropy[i] = entropy[i];
      }
      ++self->num_blocks_;
      ++split->num_types;
      self->curr_histogram_ix_ += num_contexts;
      if (self->curr_histogram_ix_ < *self->histograms_size_) {
        ClearHistogramsLiteral(
            &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
      }
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      self->target_block_size_ = self->min_block_size_;
    } else if (diff[1] < diff[0] - 20.0) {
      /* Combine this block with second last block. */
      split->lengths[self->num_blocks_] = (uint32_t)self->block_size_;
      split->types[self->num_blocks_] = split->types[self->num_blocks_ - 2];
      BROTLI_SWAP(size_t, self->last_histogram_ix_, 0, 1);
      for (i = 0; i < num_contexts; ++i) {
        histograms[self->last_histogram_ix_[0] + i] =
            combined_histo[num_contexts + i];
        last_entropy[num_contexts + i] = last_entropy[i];
        last_entropy[i] = combined_entropy[num_contexts + i];
        HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
      }
      ++self->num_blocks_;
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      self->target_block_size_ = self->min_block_size_;
    } else {
      /* Combine this block with last block. */
      split->lengths[self->num_blocks_ - 1] += (uint32_t)self->block_size_;
      for (i = 0; i < num_contexts; ++i) {
        histograms[self->last_histogram_ix_[0] + i] = combined_histo[i];
        last_entropy[i] = combined_entropy[i];
        if (split->num_types == 1) {
          last_entropy[num_contexts + i] = last_entropy[i];
        }
        HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
      }
      self->block_size_ = 0;
      if (++self->merge_last_count_ > 1) {
        self->target_block_size_ += self->min_block_size_;
      }
    }
    BROTLI_FREE(m, combined_histo);
  }
  if (is_final) {
    *self->histograms_size_ = split->num_types * num_contexts;
    split->num_blocks = self->num_blocks_;
  }
}